

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::help_name_abi_cxx11_(string *__return_storage_ptr__,Option *this,bool opt_only)

{
  ostream *poVar1;
  string local_1f8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [383];
  byte local_19;
  Option *pOStack_18;
  bool opt_only_local;
  Option *this_local;
  
  local_19 = opt_only;
  pOStack_18 = this;
  this_local = (Option *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  get_name_abi_cxx11_(&local_1c8,this,(bool)(local_19 & 1));
  poVar1 = ::std::operator<<(local_198,(string *)&local_1c8);
  help_aftername_abi_cxx11_(&local_1f8,this);
  ::std::operator<<(poVar1,(string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string help_name(bool opt_only = false) const {
        std::stringstream out;
        out << get_name(opt_only) << help_aftername();
        return out.str();
    }